

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O2

void do_stop_waiting_for_dialog_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object widget;
  Am_Object local_30;
  Am_Value v;
  Am_Value local_18;
  
  Am_Object::Get_Owner(&widget,(Am_Slot_Flags)cmd);
  bVar1 = Am_Object::Valid(&widget);
  if (bVar1) {
    v.type = 0;
    v.value.wrapper_value = (Am_Wrapper *)0x0;
    in_value = Am_Object::Get(&widget,0x169,1);
    Am_Value::operator=(&v,in_value);
    Am_Object::Am_Object(&local_30,&widget);
    Am_Value::Am_Value(&local_18,&v);
    Am_Finish_Pop_Up_Waiting(&local_30,&local_18);
    Am_Value::~Am_Value(&local_18);
    Am_Object::~Am_Object(&local_30);
    Am_Value::~Am_Value(&v);
  }
  Am_Object::~Am_Object(&widget);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_stop_waiting_for_dialog,
                 (Am_Object cmd))
{
  Am_Object widget = cmd.Get_Owner();
  if (widget.Valid()) {
    // we want to stop the text input widget if it exists
    Am_Value v;
    v = widget.Peek(Am_VALUE);
    Am_Finish_Pop_Up_Waiting(widget, v);
  }
  // else do nothing, something's not valid.
}